

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadCustom::ChLoadCustom(ChLoadCustom *this,shared_ptr<chrono::ChLoadable> *mloadable)

{
  int iVar1;
  
  ChLoadBase::ChLoadBase(&this->super_ChLoadBase);
  (this->super_ChLoadBase).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLoadCustom_0116c9a8;
  std::__shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>,
             &mloadable->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>);
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  iVar1 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar1);
  return;
}

Assistant:

ChLoadCustom::ChLoadCustom(std::shared_ptr<ChLoadable> mloadable) : loadable(mloadable) {
    load_Q.setZero(LoadGet_ndof_w());
}